

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryBone(AssbinImporter *this,IOStream *stream,aiBone *b)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  ulong uVar4;
  aiVertexWeight *paVar5;
  aiVertexWeight *local_4d0;
  aiMatrix4x4 local_49c;
  aiString local_45c;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  aiBone *local_20;
  aiBone *b_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = b;
  b_local = (aiBone *)stream;
  stream_local = (IOStream *)this;
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 != 0x123a) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  Read<unsigned_int>((IOStream *)b_local);
  Read<aiString>(&local_45c,(IOStream *)b_local);
  aiString::operator=(&local_20->mName,&local_45c);
  uVar2 = Read<unsigned_int>((IOStream *)b_local);
  local_20->mNumWeights = uVar2;
  Read<aiMatrix4x4t<float>>(&local_49c,(IOStream *)b_local);
  memcpy(&local_20->mOffsetMatrix,&local_49c,0x40);
  if ((this->shortened & 1U) == 0) {
    uVar3 = CONCAT44(0,local_20->mNumWeights);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    paVar5 = (aiVertexWeight *)operator_new__(uVar4);
    if (uVar3 != 0) {
      local_4d0 = paVar5;
      do {
        aiVertexWeight::aiVertexWeight(local_4d0);
        local_4d0 = local_4d0 + 1;
      } while (local_4d0 != paVar5 + uVar3);
    }
    local_20->mWeights = paVar5;
    ReadArray<aiVertexWeight>((IOStream *)b_local,local_20->mWeights,local_20->mNumWeights);
  }
  else {
    ReadBounds<aiVertexWeight>((IOStream *)b_local,local_20->mWeights,local_20->mNumWeights);
  }
  return;
}

Assistant:

void AssbinImporter::ReadBinaryBone( IOStream * stream, aiBone* b ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIBONE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    b->mName = Read<aiString>(stream);
    b->mNumWeights = Read<unsigned int>(stream);
    b->mOffsetMatrix = Read<aiMatrix4x4>(stream);

    // for the moment we write dumb min/max values for the bones, too.
    // maybe I'll add a better, hash-like solution later
    if (shortened) {
        ReadBounds(stream,b->mWeights,b->mNumWeights);
    } else {
        // else write as usual
        b->mWeights = new aiVertexWeight[b->mNumWeights];
        ReadArray<aiVertexWeight>(stream,b->mWeights,b->mNumWeights);
    }
}